

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool tinyexr::miniz::mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 local_header_ofs,
                  mz_uint32 ext_attributes)

{
  ulong uVar1;
  mz_bool mVar2;
  void *in_RCX;
  ushort in_DX;
  uint uVar3;
  void *in_RSI;
  long in_RDI;
  ushort in_R8W;
  void *in_R9;
  uint uVar4;
  bool bVar5;
  ushort in_stack_00000008;
  mz_uint64 in_stack_00000018;
  undefined4 in_stack_00000020;
  ushort in_stack_00000028;
  ushort in_stack_00000030;
  ushort in_stack_00000038;
  mz_uint8 central_dir_header [46];
  size_t orig_central_dir_size;
  mz_uint32 central_dir_ofs;
  mz_zip_internal_state *pState;
  size_t orig_size_4;
  size_t orig_size_3;
  size_t orig_size_2;
  size_t orig_size_1;
  size_t orig_size;
  mz_uint16 in_stack_fffffffffffffd74;
  mz_uint16 in_stack_fffffffffffffd76;
  undefined4 in_stack_fffffffffffffd7c;
  mz_uint in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd94;
  mz_uint16 in_stack_fffffffffffffda8;
  mz_uint16 in_stack_fffffffffffffdb0;
  mz_uint16 in_stack_fffffffffffffdb8;
  mz_uint64 in_stack_fffffffffffffdc0;
  mz_uint32 in_stack_fffffffffffffdc8;
  undefined4 local_21c;
  long *local_218;
  void *local_210;
  ushort local_202;
  void *local_200;
  ushort local_1f2;
  void *local_1f0;
  long local_1e8;
  long local_1d8;
  long local_1d0;
  undefined4 *local_1c8;
  long *local_1c0;
  long local_1b8;
  uint local_1ac;
  long local_1a8;
  ulong local_1a0;
  void *local_198;
  long *local_190;
  long local_188;
  uint local_17c;
  long local_178;
  ulong local_170;
  void *local_168;
  long *local_160;
  long local_158;
  uint local_14c;
  long local_148;
  ulong local_140;
  void *local_138;
  long *local_130;
  long local_128;
  uint local_11c;
  long local_118;
  long local_110;
  undefined1 *local_108;
  long *local_100;
  long local_f8;
  uint local_f0;
  undefined4 local_ec;
  ulong local_e8;
  long *local_e0;
  long local_d8;
  int local_d0;
  undefined4 local_cc;
  ulong local_c8;
  long *local_c0;
  long local_b8;
  int local_b0;
  undefined4 local_ac;
  ulong local_a8;
  long *local_a0;
  long local_98;
  int local_90;
  undefined4 local_8c;
  ulong local_88;
  long *local_80;
  long local_78;
  int local_70;
  undefined4 local_6c;
  ulong local_68;
  long *local_60;
  long local_58;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  long *local_40;
  long local_38;
  
  local_218 = *(long **)(in_RDI + 0x58);
  local_21c = (undefined4)local_218[1];
  uVar1 = local_218[1];
  if (((ulong)central_dir_header._8_8_ < 0x100000000) &&
     (local_218[1] + 0x2e + (ulong)in_DX + (ulong)in_R8W + (ulong)in_stack_00000008 < 0x100000000))
  {
    uVar3 = (uint)in_stack_00000038;
    uVar4 = (uint)(ushort)central_dir_header._0_2_;
    local_210 = in_R9;
    local_202 = in_R8W;
    local_200 = in_RCX;
    local_1f2 = in_DX;
    local_1f0 = in_RSI;
    local_1e8 = in_RDI;
    mVar2 = mz_zip_writer_create_central_dir_header
                      ((mz_zip_archive *)CONCAT44(in_stack_fffffffffffffd84,(uint)in_stack_00000030)
                       ,(mz_uint8 *)CONCAT44(in_stack_fffffffffffffd7c,(uint)in_stack_00000028),
                       in_stack_fffffffffffffd76,in_stack_fffffffffffffd74,
                       (mz_uint16)((uint)in_stack_00000020 >> 0x10),in_stack_00000018,
                       CONCAT44(in_stack_fffffffffffffd94,uVar4),(mz_uint32)central_dir_header._8_8_
                       ,central_dir_header._16_2_,in_stack_fffffffffffffda8,
                       in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0
                       ,in_stack_fffffffffffffdc8);
    if (mVar2 != 0) {
      local_108 = &stack0xfffffffffffffda8;
      local_f8 = local_1e8;
      local_100 = local_218;
      local_110 = 0x2e;
      local_118 = local_218[1];
      local_e8 = local_118 + 0x2e;
      local_d8 = local_1e8;
      local_e0 = local_218;
      local_ec = 1;
      if (((ulong)local_218[2] < local_e8) &&
         (mVar2 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)central_dir_header._8_8_,
                             (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd94,uVar4),
                             CONCAT44(in_stack_fffffffffffffd8c,uVar3),in_stack_fffffffffffffd84),
         mVar2 == 0)) {
        local_d0 = 0;
      }
      else {
        local_e0[1] = local_e8;
        local_d0 = 1;
      }
      bVar5 = local_d0 != 0;
      if (bVar5) {
        memcpy((void *)(*local_100 + local_118 * (ulong)*(uint *)(local_100 + 3)),local_108,
               local_110 * (ulong)*(uint *)(local_100 + 3));
      }
      local_f0 = (uint)bVar5;
      if (local_f0 != 0) {
        local_140 = (ulong)local_1f2;
        local_128 = local_1e8;
        local_130 = local_218;
        local_138 = local_1f0;
        local_148 = local_218[1];
        local_c8 = local_148 + local_140;
        local_b8 = local_1e8;
        local_c0 = local_218;
        local_cc = 1;
        if (((ulong)local_218[2] < local_c8) &&
           (mVar2 = mz_zip_array_ensure_capacity
                              ((mz_zip_archive *)central_dir_header._8_8_,
                               (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd94,uVar4),
                               CONCAT44(in_stack_fffffffffffffd8c,uVar3),in_stack_fffffffffffffd84),
           mVar2 == 0)) {
          local_b0 = 0;
        }
        else {
          local_c0[1] = local_c8;
          local_b0 = 1;
        }
        bVar5 = local_b0 != 0;
        if (bVar5) {
          memcpy((void *)(*local_130 + local_148 * (ulong)*(uint *)(local_130 + 3)),local_138,
                 local_140 * *(uint *)(local_130 + 3));
        }
        local_11c = (uint)bVar5;
        if (local_11c != 0) {
          local_170 = (ulong)local_202;
          local_158 = local_1e8;
          local_160 = local_218;
          local_168 = local_200;
          local_178 = local_218[1];
          local_a8 = local_178 + local_170;
          local_98 = local_1e8;
          local_a0 = local_218;
          local_ac = 1;
          if (((ulong)local_218[2] < local_a8) &&
             (mVar2 = mz_zip_array_ensure_capacity
                                ((mz_zip_archive *)central_dir_header._8_8_,
                                 (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd94,uVar4),
                                 CONCAT44(in_stack_fffffffffffffd8c,uVar3),in_stack_fffffffffffffd84
                                ), mVar2 == 0)) {
            local_90 = 0;
          }
          else {
            local_a0[1] = local_a8;
            local_90 = 1;
          }
          bVar5 = local_90 != 0;
          if (bVar5) {
            memcpy((void *)(*local_160 + local_178 * (ulong)*(uint *)(local_160 + 3)),local_168,
                   local_170 * *(uint *)(local_160 + 3));
          }
          local_14c = (uint)bVar5;
          if (local_14c != 0) {
            local_1a0 = (ulong)in_stack_00000008;
            local_188 = local_1e8;
            local_190 = local_218;
            local_198 = local_210;
            local_1a8 = local_218[1];
            local_88 = local_1a8 + local_1a0;
            local_78 = local_1e8;
            local_80 = local_218;
            local_8c = 1;
            if (((ulong)local_218[2] < local_88) &&
               (mVar2 = mz_zip_array_ensure_capacity
                                  ((mz_zip_archive *)central_dir_header._8_8_,
                                   (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd94,uVar4),
                                   CONCAT44(in_stack_fffffffffffffd8c,uVar3),
                                   in_stack_fffffffffffffd84), mVar2 == 0)) {
              local_70 = 0;
            }
            else {
              local_80[1] = local_88;
              local_70 = 1;
            }
            bVar5 = local_70 != 0;
            if (bVar5) {
              memcpy((void *)(*local_190 + local_1a8 * (ulong)*(uint *)(local_190 + 3)),local_198,
                     local_1a0 * *(uint *)(local_190 + 3));
            }
            local_17c = (uint)bVar5;
            if (local_17c != 0) {
              local_1c0 = local_218 + 4;
              local_1b8 = local_1e8;
              local_1c8 = &local_21c;
              local_1d0 = 1;
              local_1d8 = local_218[5];
              local_68 = local_1d8 + 1;
              local_58 = local_1e8;
              local_6c = 1;
              local_60 = local_1c0;
              if (((ulong)local_218[6] < local_68) &&
                 (mVar2 = mz_zip_array_ensure_capacity
                                    ((mz_zip_archive *)central_dir_header._8_8_,
                                     (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd94,uVar4),
                                     CONCAT44(in_stack_fffffffffffffd8c,uVar3),
                                     in_stack_fffffffffffffd84), mVar2 == 0)) {
                local_50 = 0;
              }
              else {
                local_60[1] = local_68;
                local_50 = 1;
              }
              bVar5 = local_50 != 0;
              if (bVar5) {
                memcpy((void *)(*local_1c0 + local_1d8 * (ulong)*(uint *)(local_1c0 + 3)),local_1c8,
                       local_1d0 * (ulong)*(uint *)(local_1c0 + 3));
              }
              local_1ac = (uint)bVar5;
              if (local_1ac != 0) {
                return 1;
              }
            }
          }
        }
      }
      local_38 = local_1e8;
      local_40 = local_218;
      local_4c = 0;
      local_48 = uVar1;
      if ((uVar1 <= (ulong)local_218[2]) ||
         (mVar2 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)central_dir_header._8_8_,
                             (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd94,uVar4),
                             CONCAT44(in_stack_fffffffffffffd8c,uVar3),in_stack_fffffffffffffd84),
         mVar2 != 0)) {
        local_40[1] = local_48;
      }
    }
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  // No zip64 support yet
  if ((local_header_ofs > 0xFFFFFFFF) ||
      (((mz_uint64)pState->m_central_dir.m_size +
        MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
        comment_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size, extra_size, comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return MZ_FALSE;

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    // Try to push the central directory array back into its original state.
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  return MZ_TRUE;
}